

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

uint LiteScript::AddCallback
               (_func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
                *value)

{
  size_type sVar1;
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *local_10;
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *value_local;
  
  local_10 = value;
  std::
  vector<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
  ::push_back(&Callback::List,&local_10);
  sVar1 = std::
          vector<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
          ::size(&Callback::List);
  return (int)sVar1 - 1;
}

Assistant:

unsigned int LiteScript::AddCallback(Variable (*value)(State &, std::vector<Variable> &)) {
    Callback::List.push_back(value);
    return Callback::List.size() - 1;
}